

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SchemaClear(void *p)

{
  Schema *pSVar1;
  Table *pTab;
  sqlite3 xdb;
  Schema *pSchema;
  HashElem *pElem;
  Hash temp2;
  Hash temp1;
  void *p_local;
  
  xdb.pDbData = (DbClientData *)p;
  memset(&pTab,0,0x310);
  temp2.ht = (_ht *)(xdb.pDbData)->pData;
  pSVar1 = (Schema *)(xdb.pDbData)->xDestructor;
  pElem = *(HashElem **)xdb.pDbData[1].zName;
  temp2._0_8_ = xdb.pDbData[2].pNext;
  temp2.first = (HashElem *)xdb.pDbData[2].pData;
  sqlite3HashInit((Hash *)xdb.pDbData[1].zName);
  sqlite3HashClear((Hash *)(xdb.pDbData + 1));
  for (pSchema = (Schema *)temp2._0_8_; pSchema != (Schema *)0x0; pSchema = *(Schema **)pSchema) {
    sqlite3DeleteTrigger((sqlite3 *)&pTab,(Trigger *)(pSchema->tblHash).first);
  }
  sqlite3HashClear((Hash *)&pElem);
  sqlite3HashInit((Hash *)&(xdb.pDbData)->pData);
  for (pSchema = pSVar1; pSchema != (Schema *)0x0; pSchema = *(Schema **)pSchema) {
    sqlite3DeleteTable((sqlite3 *)&pTab,(Table *)(pSchema->tblHash).first);
  }
  sqlite3HashClear((Hash *)&temp2.ht);
  sqlite3HashClear((Hash *)&xdb.pDbData[2].xDestructor);
  xdb.pDbData[3].pData = (void *)0x0;
  if (((ulong)xdb.pDbData[3].xDestructor & 0x10000) != 0) {
    *(int *)((long)&(xdb.pDbData)->pNext + 4) = *(int *)((long)&(xdb.pDbData)->pNext + 4) + 1;
  }
  *(ushort *)((long)&xdb.pDbData[3].xDestructor + 2) =
       *(ushort *)((long)&xdb.pDbData[3].xDestructor + 2) & 0xfff6;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SchemaClear(void *p){
  Hash temp1;
  Hash temp2;
  HashElem *pElem;
  Schema *pSchema = (Schema *)p;
  sqlite3 xdb;

  memset(&xdb, 0, sizeof(xdb));
  temp1 = pSchema->tblHash;
  temp2 = pSchema->trigHash;
  sqlite3HashInit(&pSchema->trigHash);
  sqlite3HashClear(&pSchema->idxHash);
  for(pElem=sqliteHashFirst(&temp2); pElem; pElem=sqliteHashNext(pElem)){
    sqlite3DeleteTrigger(&xdb, (Trigger*)sqliteHashData(pElem));
  }
  sqlite3HashClear(&temp2);
  sqlite3HashInit(&pSchema->tblHash);
  for(pElem=sqliteHashFirst(&temp1); pElem; pElem=sqliteHashNext(pElem)){
    Table *pTab = sqliteHashData(pElem);
    sqlite3DeleteTable(&xdb, pTab);
  }
  sqlite3HashClear(&temp1);
  sqlite3HashClear(&pSchema->fkeyHash);
  pSchema->pSeqTab = 0;
  if( pSchema->schemaFlags & DB_SchemaLoaded ){
    pSchema->iGeneration++;
  }
  pSchema->schemaFlags &= ~(DB_SchemaLoaded|DB_ResetWanted);
}